

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexst.cpp
# Opt level: O0

void icu_63::initStaticSets(UErrorCode *status)

{
  UBool UVar1;
  RegexStaticSets *pRVar2;
  code *p;
  RegexStaticSets *local_30;
  UErrorCode *status_local;
  
  p = regex_cleanup;
  ucln_i18n_registerCleanup_63(UCLN_I18N_REGEX,regex_cleanup);
  pRVar2 = (RegexStaticSets *)UMemory::operator_new((UMemory *)0x5e0,(size_t)p);
  local_30 = (RegexStaticSets *)0x0;
  if (pRVar2 != (RegexStaticSets *)0x0) {
    p = (code *)status;
    RegexStaticSets::RegexStaticSets(pRVar2,status);
    local_30 = pRVar2;
  }
  RegexStaticSets::gStaticSets = local_30;
  UVar1 = ::U_FAILURE(*status);
  pRVar2 = RegexStaticSets::gStaticSets;
  if (UVar1 != '\0') {
    if (RegexStaticSets::gStaticSets != (RegexStaticSets *)0x0) {
      RegexStaticSets::~RegexStaticSets(RegexStaticSets::gStaticSets);
      UMemory::operator_delete((UMemory *)pRVar2,p);
    }
    RegexStaticSets::gStaticSets = (RegexStaticSets *)0x0;
  }
  if (RegexStaticSets::gStaticSets == (RegexStaticSets *)0x0) {
    UVar1 = ::U_SUCCESS(*status);
    if (UVar1 != '\0') {
      *status = U_MEMORY_ALLOCATION_ERROR;
    }
  }
  return;
}

Assistant:

static void U_CALLCONV initStaticSets(UErrorCode &status) {
    U_ASSERT(RegexStaticSets::gStaticSets == NULL);
    ucln_i18n_registerCleanup(UCLN_I18N_REGEX, regex_cleanup);
    RegexStaticSets::gStaticSets = new RegexStaticSets(&status);
    if (U_FAILURE(status)) {
        delete RegexStaticSets::gStaticSets;
        RegexStaticSets::gStaticSets = NULL;
    }
    if (RegexStaticSets::gStaticSets == NULL && U_SUCCESS(status)) {
        status = U_MEMORY_ALLOCATION_ERROR;
    }
}